

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUVProcessChain.cxx
# Opt level: O2

void printResults(vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                  *actual,vector<ExpectedStatus,_std::allocator<ExpectedStatus>_> *expected)

{
  pointer pEVar1;
  pointer ppSVar2;
  ostream *poVar3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  Status **a;
  pointer ppSVar5;
  pointer pEVar6;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"Expected: ");
  std::endl<char,std::char_traits<char>>(poVar3);
  pEVar1 = (expected->super__Vector_base<ExpectedStatus,_std::allocator<ExpectedStatus>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pEVar6 = (expected->super__Vector_base<ExpectedStatus,_std::allocator<ExpectedStatus>_>).
                _M_impl.super__Vector_impl_data._M_start; pEVar6 != pEVar1; pEVar6 = pEVar6 + 1) {
    if (pEVar6->Finished == true) {
      poVar3 = std::operator<<((ostream *)&std::cout,"  ExitStatus: ");
      local_70._8_8_ = (pEVar6->Status).ExitStatus;
      local_70._1_7_ = 0;
      local_70._M_pod_data[0] = pEVar6->MatchExitStatus;
      local_58 = std::
                 _Function_handler<std::basic_ostream<char,_std::char_traits<char>_>_&(std::basic_ostream<char,_std::char_traits<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Tests/CMakeLib/testUVProcessChain.cxx:90:10)>
                 ::_M_invoke;
      local_60 = std::
                 _Function_handler<std::basic_ostream<char,_std::char_traits<char>_>_&(std::basic_ostream<char,_std::char_traits<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Tests/CMakeLib/testUVProcessChain.cxx:90:10)>
                 ::_M_manager;
      pbVar4 = std::
               function<std::basic_ostream<char,_std::char_traits<char>_>_&(std::basic_ostream<char,_std::char_traits<char>_>_&)>
               ::operator()((function<std::basic_ostream<char,_std::char_traits<char>_>_&(std::basic_ostream<char,_std::char_traits<char>_>_&)>
                             *)&local_70,poVar3);
      poVar3 = std::operator<<(pbVar4,", TermSignal: ");
      local_50._8_8_ = 0;
      local_50._M_unused._M_member_pointer =
           (ulong)(uint)(pEVar6->Status).TermSignal << 0x20 | (ulong)pEVar6->MatchTermSignal;
      local_38 = std::
                 _Function_handler<std::basic_ostream<char,_std::char_traits<char>_>_&(std::basic_ostream<char,_std::char_traits<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Tests/CMakeLib/testUVProcessChain.cxx:90:10)>
                 ::_M_invoke;
      local_40 = std::
                 _Function_handler<std::basic_ostream<char,_std::char_traits<char>_>_&(std::basic_ostream<char,_std::char_traits<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Tests/CMakeLib/testUVProcessChain.cxx:90:10)>
                 ::_M_manager;
      pbVar4 = std::
               function<std::basic_ostream<char,_std::char_traits<char>_>_&(std::basic_ostream<char,_std::char_traits<char>_>_&)>
               ::operator()((function<std::basic_ostream<char,_std::char_traits<char>_>_&(std::basic_ostream<char,_std::char_traits<char>_>_&)>
                             *)&local_50,poVar3);
      std::endl<char,std::char_traits<char>>(pbVar4);
      std::_Function_base::~_Function_base((_Function_base *)&local_50);
      std::_Function_base::~_Function_base((_Function_base *)&local_70);
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,"  null");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Actual:");
  std::endl<char,std::char_traits<char>>(poVar3);
  ppSVar2 = (actual->
            super__Vector_base<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  for (ppSVar5 = (actual->
                 super__Vector_base<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppSVar5 != ppSVar2;
      ppSVar5 = ppSVar5 + 1) {
    if (*ppSVar5 == (Status *)0x0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"  null");
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,"  ExitStatus: ");
      poVar3 = std::ostream::_M_insert<long>((long)poVar3);
      poVar3 = std::operator<<(poVar3,", TermSignal: ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(*ppSVar5)->TermSignal);
    }
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  return;
}

Assistant:

static void printResults(
  const std::vector<const cmUVProcessChain::Status*>& actual,
  const std::vector<ExpectedStatus>& expected)
{
  std::cout << "Expected: " << std::endl;
  for (auto const& e : expected) {
    if (e.Finished) {
      std::cout << "  ExitStatus: "
                << printExpected(e.MatchExitStatus, e.Status.ExitStatus)
                << ", TermSignal: "
                << printExpected(e.MatchTermSignal, e.Status.TermSignal)
                << std::endl;
    } else {
      std::cout << "  null" << std::endl;
    }
  }
  std::cout << "Actual:" << std::endl;
  for (auto const& a : actual) {
    if (a) {
      std::cout << "  ExitStatus: " << a->ExitStatus
                << ", TermSignal: " << a->TermSignal << std::endl;
    } else {
      std::cout << "  null" << std::endl;
    }
  }
}